

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_ini>
          (xr_ini_writer *this,
          vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container)

{
  bool bVar1;
  reference point;
  __normal_iterator<const_xray_re::way_point_le_*,_std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>_>
  local_38;
  const_iterator end;
  const_iterator it;
  uint32_t id;
  vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container_local;
  xr_ini_writer *this_local;
  
  it._M_current._4_4_ = 0;
  end = std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::begin(container)
  ;
  local_38._M_current =
       (way_point_le *)
       std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) break;
    point = __gnu_cxx::
            __normal_iterator<const_xray_re::way_point_le_*,_std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>_>
            ::operator*(&end);
    write_point_ini::operator()
              ((write_point_ini *)((long)&this_local + 7),point,this,it._M_current._4_4_);
    __gnu_cxx::
    __normal_iterator<const_xray_re::way_point_le_*,_std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, F write)
{
	uint32_t id = 0;
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it, ++id) {
		write(*it, this, id);
	}
}